

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CBufferIndirectDrawArraysSimple<glcts::(anonymous_namespace)::test_api::GL>::
Run(CBufferIndirectDrawArraysSimple<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  allocator<tcu::Vector<float,_4>_> *paVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  uint heightRef;
  size_type sVar5;
  reference pvVar6;
  long _code;
  DILogger local_420;
  undefined1 local_2a0 [8];
  DIResult result;
  Vector<float,_4> local_110;
  undefined1 local_100 [8];
  CColorArray bufferTest;
  Vector<float,_4> local_e0;
  undefined1 local_d0 [8];
  CColorArray bufferRef;
  DrawArraysIndirectCommand indirectArrays;
  CColorArray coords;
  allocator<char> local_59;
  string local_58;
  string local_38;
  CBufferIndirectDrawArraysSimple<glcts::(anonymous_namespace)::test_api::GL> *local_18;
  CBufferIndirectDrawArraysSimple<glcts::(anonymous_namespace)::test_api::GL> *this_local;
  
  local_18 = this;
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_38,&local_58,
                     (string *)
                     &coords.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
  this->_program = GVar2;
  std::__cxx11::string::~string
            ((string *)
             &coords.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->_program == 0) {
    this_local = (CBufferIndirectDrawArraysSimple<glcts::(anonymous_namespace)::test_api::GL> *)
                 &DAT_ffffffffffffffff;
  }
  else {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_program);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &indirectArrays.first);
    DrawIndirectBase::PrimitiveGen
              (&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&indirectArrays.first);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_vao);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_buffer);
    sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indirectArrays.first);
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &indirectArrays.first,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,sVar5 << 4,pvVar6,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    bufferRef.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    indirectArrays.count = 0;
    indirectArrays.primCount = 0;
    sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indirectArrays.first);
    bufferRef.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(1,(int)sVar5);
    indirectArrays.count = 0;
    indirectArrays.primCount = 0;
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0x10,
               &bufferRef.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0x88e4);
    glu::CallLogWrapper::glDrawArraysIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,(void *)0x0);
    iVar3 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar4 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_e0,0.1,0.2,0.3,1.0);
    paVar1 = (allocator<tcu::Vector<float,_4>_> *)
             ((long)&bufferTest.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_d0,
               (long)(iVar3 * iVar4),&local_e0,paVar1);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar3 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar4 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_110,0.0);
    paVar1 = (allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_100,
               (long)(iVar3 * iVar4),&local_110,paVar1);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7));
    DIResult::DIResult((DIResult *)local_2a0);
    iVar3 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar4 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_100,0);
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
              (&this->super_DrawIndirectBase,0,0,iVar3,iVar4,pvVar6);
    widthTest = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    heightTest = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    widthRef = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    heightRef = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    _code = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_100,widthTest,heightTest,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_d0,widthRef,heightRef);
    DIResult::sub_result(&local_420,(DIResult *)local_2a0,_code);
    DILogger::~DILogger(&local_420);
    this_local = (CBufferIndirectDrawArraysSimple<glcts::(anonymous_namespace)::test_api::GL> *)
                 DIResult::code((DIResult *)local_2a0);
    DIResult::~DIResult((DIResult *)local_2a0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_100);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_d0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &indirectArrays.first);
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawArraysIndirectCommand indirectArrays = { 0, 0, 0, 0 };
		indirectArrays.count					 = static_cast<GLuint>(coords.size());
		indirectArrays.primCount				 = 1;
		indirectArrays.first					 = 0;
		indirectArrays.reservedMustBeZero		 = 0;

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), &indirectArrays, GL_STATIC_DRAW);

		glDrawArraysIndirect(GL_TRIANGLES, 0);

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}